

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          CappedArray<char,_14UL> *params_3,ArrayPtr<const_char> *params_4,StringPtr *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12)

{
  size_t size;
  char *target;
  ArrayPtr<const_char> *first;
  ArrayPtr<const_char> *rest;
  ArrayPtr<const_char> *rest_1;
  CappedArray<char,_14UL> *rest_2;
  ArrayPtr<const_char> *rest_3;
  StringPtr *rest_4;
  ArrayPtr<const_char> *rest_5;
  ArrayPtr<const_char> *rest_6;
  ArrayPtr<const_char> *rest_7;
  ArrayPtr<const_char> *rest_8;
  ArrayPtr<const_char> *rest_9;
  ArrayPtr<const_char> *rest_10;
  ArrayPtr<const_char> *rest_11;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  CappedArray<char,_14UL> *local_60;
  ArrayPtr<const_char> *params_local_4;
  CappedArray<char,_14UL> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  String *result;
  
  local_61 = 0;
  local_60 = params_3;
  params_local_4 = params_2;
  params_local_3 = (CappedArray<char,_14UL> *)params_1;
  params_local_2 = params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  local_e0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)this);
  local_d8 = ArrayPtr<const_char>::size(params_local_2);
  local_d0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_3);
  local_c8 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_local_4);
  local_c0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_60);
  local_b8 = StringPtr::size((StringPtr *)params_4);
  local_b0 = ArrayPtr<const_char>::size(&params_5->content);
  local_a8 = ArrayPtr<const_char>::size(params_6);
  local_a0 = ArrayPtr<const_char>::size(params_7);
  local_98 = ArrayPtr<const_char>::size(params_8);
  local_90 = ArrayPtr<const_char>::size(params_9);
  local_88 = ArrayPtr<const_char>::size(params_10);
  local_80 = ArrayPtr<const_char>::size(params_11);
  local_78 = (_ *)&local_e0;
  local_70 = 0xd;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0xd;
  size = sum(local_78,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_3);
  rest_2 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)local_60);
  rest_4 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>(&params_5->content);
  rest_6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  rest_7 = fwd<kj::ArrayPtr<char_const>>(params_7);
  rest_8 = fwd<kj::ArrayPtr<char_const>>(params_8);
  rest_9 = fwd<kj::ArrayPtr<char_const>>(params_9);
  rest_10 = fwd<kj::ArrayPtr<char_const>>(params_10);
  rest_11 = fwd<kj::ArrayPtr<char_const>>(params_11);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,first,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,
             rest_10,rest_11);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}